

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O3

void __thiscall HighVariable::merge(HighVariable *this,HighVariable *tv2,bool isspeculative)

{
  int2 *piVar1;
  pointer ppVVar2;
  Varnode *pVVar3;
  LowlevelError *this_00;
  int iVar4;
  long lVar5;
  long lVar6;
  vector<Varnode_*,_std::allocator<Varnode_*>_> instcopy;
  undefined1 local_48 [32];
  value_type local_28;
  
  if (tv2 != this) {
    *(byte *)&this->highflags = (byte)this->highflags | 3;
    if (isspeculative) {
      ppVVar2 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = (long)(tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppVVar2;
      if (lVar5 == 0) {
        iVar4 = this->numMergeClasses;
      }
      else {
        lVar5 = lVar5 >> 3;
        iVar4 = this->numMergeClasses;
        lVar6 = 0;
        do {
          pVVar3 = ppVVar2[lVar6];
          pVVar3->high = this;
          piVar1 = &pVVar3->mergegroup;
          *piVar1 = *piVar1 + (short)iVar4;
          lVar6 = lVar6 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
      this->numMergeClasses = iVar4 + tv2->numMergeClasses;
    }
    else {
      if ((this->numMergeClasses != 1) || (tv2->numMergeClasses != 1)) {
        this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
        local_48._0_8_ = local_48 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,
                   "Making a non-speculative merge after speculative merges have occurred","");
        LowlevelError::LowlevelError(this_00,(string *)local_48);
        __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      ppVVar2 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = (long)(tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppVVar2;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 3;
        lVar6 = 0;
        do {
          ppVVar2[lVar6]->high = this;
          lVar6 = lVar6 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
    }
    std::vector<Varnode_*,_std::allocator<Varnode_*>_>::vector
              ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_48,&this->inst);
    local_28 = (value_type)0x0;
    std::vector<Varnode_*,_std::allocator<Varnode_*>_>::resize
              (&this->inst,
               ((long)(tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) +
               ((long)(this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_start >> 3),&local_28);
    std::
    __merge<__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Varnode_const*,Varnode_const*)>>
              ((__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               local_48._0_8_,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               local_48._8_8_,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               (_Iter_comp_iter<bool_(*)(const_Varnode_*,_const_Varnode_*)>)compareJustLoc);
    ppVVar2 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppVVar2) {
      (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVVar2;
    }
    if (((this->highflags & 4) == 0) && ((tv2->highflags & 4) == 0)) {
      Cover::merge(&this->wholecover,&tv2->wholecover);
    }
    else {
      this->highflags = this->highflags | 4;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_CoverBlock>,_std::_Select1st<std::pair<const_int,_CoverBlock>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CoverBlock>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_CoverBlock>,_std::_Select1st<std::pair<const_int,_CoverBlock>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CoverBlock>_>_>
                 *)&tv2->wholecover);
    ppVVar2 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppVVar2 != (pointer)0x0) {
      operator_delete(ppVVar2);
    }
    operator_delete(tv2);
    if ((Varnode **)local_48._0_8_ != (Varnode **)0x0) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  return;
}

Assistant:

void HighVariable::merge(HighVariable *tv2,bool isspeculative)

{
  int4 i;

  if (tv2 == this) return;

//   if (isAddrTied() && tv2->isAddrTied()) {
//     if (tied_varnode()->getAddr() != tv2->tied_varnode()->getAddr())
//       throw LowlevelError("Merging different addrtieds");
//   }

  highflags |= (HighVariable::flagsdirty|HighVariable::typedirty);

  if (isspeculative) {
    for(i=0;i<tv2->inst.size();++i) {
      Varnode *vn = tv2->inst[i];
      vn->setHigh(this,vn->getMergeGroup() + numMergeClasses);
    }
    numMergeClasses += tv2->numMergeClasses;
  }
  else {
    if ((numMergeClasses!=1)||(tv2->numMergeClasses!=1))
      throw LowlevelError("Making a non-speculative merge after speculative merges have occurred");
    for(i=0;i<tv2->inst.size();++i) {
      Varnode *vn = tv2->inst[i];
      vn->setHigh(this,vn->getMergeGroup());
    }
  }
  vector<Varnode *> instcopy(inst);
  inst.resize(inst.size()+tv2->inst.size(),(Varnode *)0);
  std::merge(instcopy.begin(),instcopy.end(),tv2->inst.begin(),tv2->inst.end(),inst.begin(),compareJustLoc);
  tv2->inst.clear();

  if (((highflags&HighVariable::coverdirty)==0)&&((tv2->highflags&HighVariable::coverdirty)==0))
    wholecover.merge(tv2->wholecover);
  else
    highflags |= HighVariable::coverdirty;

  delete tv2;
}